

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O2

void __thiscall FormatTest_StrError_Test::TestBody(FormatTest_StrError_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper AStack_168;
  AssertionResult gtest_ar;
  size_t message_size;
  string gtest_expected_message;
  char *message;
  int result;
  char buffer [256];
  
  message = (char *)0x0;
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid buffer",(allocator *)&message_size);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      message = (char *)0x0;
      fmt::v5::anon_unknown_10::safe_strerror(0x21,&message,0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [131])
               "Expected: fmt::safe_strerror(33, message = nullptr, 0) throws an exception of type assertion_failure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&message_size,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
             ,0x8e,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&message_size,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message_size);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid buffer",(allocator *)&message_size);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      message = buffer;
      fmt::v5::anon_unknown_10::safe_strerror(0x21,&message,0);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [130])
               "Expected: fmt::safe_strerror(33, message = buffer, 0) throws an exception of type assertion_failure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&message_size,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
             ,0x90,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&message_size,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message_size);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  buffer[0] = 'x';
  message = buffer;
  result = fmt::v5::anon_unknown_10::safe_strerror(-1,&message,0x100);
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_expected_message,"result","0",&result,(int *)&gtest_ar);
  if ((char)gtest_expected_message._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_expected_message._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_expected_message._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&message_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&message_size,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message_size);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_message._M_string_length);
  message_size = strlen(message);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperGE<unsigned_int,unsigned_long>
            ((internal *)&gtest_expected_message,"BUFFER_SIZE - 1u","message_size",(uint *)&gtest_ar
             ,&message_size);
  if ((char)gtest_expected_message._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_expected_message._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_expected_message._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_message._M_string_length);
  get_system_error_abi_cxx11_(&gtest_expected_message,-1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char*>
            ((internal *)&gtest_ar,"get_system_error(error_code)","message",&gtest_expected_message,
             &message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  message = buffer;
  result = fmt::v5::anon_unknown_10::safe_strerror(-1,&message,message_size);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_expected_message,"34","result",(int *)&gtest_ar,&result);
  if ((char)gtest_expected_message._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_expected_message._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_expected_message._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_message._M_string_length);
  message = buffer;
  result = fmt::v5::anon_unknown_10::safe_strerror(-1,&message,1);
  testing::internal::CmpHelperEQ<char[256],char*>
            ((internal *)&gtest_expected_message,"buffer","message",&buffer,&message);
  if ((char)gtest_expected_message._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_expected_message._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_expected_message._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_message._M_string_length);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_expected_message,"34","result",(int *)&gtest_ar,&result);
  if ((char)gtest_expected_message._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_expected_message._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_expected_message._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_message._M_string_length);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ((internal *)&gtest_expected_message,"\"\"","message","",message)
  ;
  if ((char)gtest_expected_message._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_expected_message._M_string_length != 0) {
      pcVar2 = *(char **)gtest_expected_message._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-impl-test.cc"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_168);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_message._M_string_length);
  return;
}

Assistant:

TEST(FormatTest, StrError) {
  char *message = FMT_NULL;
  char buffer[BUFFER_SIZE];
  EXPECT_ASSERT(fmt::safe_strerror(EDOM, message = FMT_NULL, 0),
                "invalid buffer");
  EXPECT_ASSERT(fmt::safe_strerror(EDOM, message = buffer, 0),
                "invalid buffer");
  buffer[0] = 'x';
#if defined(_GNU_SOURCE) && !defined(__COVERITY__)
  // Use invalid error code to make sure that safe_strerror returns an error
  // message in the buffer rather than a pointer to a static string.
  int error_code = -1;
#else
  int error_code = EDOM;
#endif

  int result = fmt::safe_strerror(error_code, message = buffer, BUFFER_SIZE);
  EXPECT_EQ(result, 0);
  std::size_t message_size = std::strlen(message);
  EXPECT_GE(BUFFER_SIZE - 1u, message_size);
  EXPECT_EQ(get_system_error(error_code), message);

  // safe_strerror never uses buffer on MinGW.
#ifndef __MINGW32__
  result = fmt::safe_strerror(error_code, message = buffer, message_size);
  EXPECT_EQ(ERANGE, result);
  result = fmt::safe_strerror(error_code, message = buffer, 1);
  EXPECT_EQ(buffer, message);  // Message should point to buffer.
  EXPECT_EQ(ERANGE, result);
  EXPECT_STREQ("", message);
#endif
}